

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

void __thiscall
crnlib::dxt_hc::determine_alpha_endpoint_codebook_task(dxt_hc *this,uint64 data,void *param_2)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  alpha_cluster *paVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint8 t;
  long lVar16;
  bool bVar17;
  float fVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  float fVar26;
  float fVar28;
  int iVar29;
  float fVar30;
  undefined1 auVar27 [16];
  float fVar31;
  uint uVar33;
  undefined1 auVar32 [16];
  uint uVar34;
  vector<unsigned_char> selectors;
  results results;
  params params;
  params refinerParams;
  results refinerResults;
  uint block_values [8];
  dxt_endpoint_refiner refiner;
  uint alpha_values [8];
  uint encoding_weight [8];
  dxt5_endpoint_optimizer optimizer;
  elemental_vector local_5e8;
  long local_5d8;
  results local_5d0;
  params local_5b8;
  params local_598;
  ulong local_560;
  vector<unsigned_long_long> *local_558;
  ulong local_550;
  dxt_hc *local_548;
  ulong local_540;
  vector<unsigned_int> *local_538;
  vector<unsigned_long_long> *local_530;
  ulong local_528;
  ulong local_520;
  results local_518;
  uint local_508 [8];
  dxt_endpoint_refiner local_4e8;
  uint auStack_4d8 [8];
  uint auStack_4b8 [10];
  dxt5_endpoint_optimizer local_490;
  
  uVar2 = this->m_pTask_pool->m_num_threads;
  dxt5_endpoint_optimizer::dxt5_endpoint_optimizer(&local_490);
  dxt_endpoint_refiner::dxt_endpoint_refiner(&local_4e8);
  local_5e8.m_p = (uint8 *)0x0;
  local_5e8.m_size = 0;
  local_5e8.m_capacity = 0;
  if ((uint)data < (this->m_alpha_clusters).m_size) {
    local_558 = this->m_block_selectors;
    local_548 = this;
    do {
      uVar8 = data & 0xffffffff;
      lVar10 = uVar8 * 0x90;
      paVar4 = (this->m_alpha_clusters).m_p;
      uVar12 = (uint)data;
      if (paVar4[uVar8].pixels.m_size != 0) {
        local_5b8.m_block_index = 0;
        local_5b8.m_pPixels = paVar4[uVar8].pixels.m_p;
        uVar14 = paVar4[uVar8].pixels.m_size;
        local_5b8.m_comp_index = 0;
        local_5b8.m_quality = cCRNDXTQualityUber;
        local_5b8.m_use_both_block_types = false;
        local_5d8 = lVar10;
        local_5b8.m_num_pixels = uVar14;
        if (local_5e8.m_size != uVar14) {
          if (local_5e8.m_size <= uVar14) {
            if (local_5e8.m_capacity < uVar14) {
              elemental_vector::increase_capacity
                        (&local_5e8,uVar14,local_5e8.m_size + 1 == uVar14,1,(object_mover)0x0,false)
              ;
            }
            memset((uint8 *)((long)local_5e8.m_p + (local_5e8._8_8_ & 0xffffffff)),0,
                   (ulong)(uVar14 - local_5e8.m_size));
          }
          local_5e8.m_size = uVar14;
        }
        local_5d0.m_pSelectors = (uint8 *)local_5e8.m_p;
        dxt5_endpoint_optimizer::compute(&local_490,&local_5b8,&local_5d0);
        paVar4[uVar8].first_endpoint = (uint)local_5d0.m_first_endpoint;
        paVar4[uVar8].second_endpoint = (uint)local_5d0.m_second_endpoint;
        dxt5_block::get_block_values
                  (local_508,paVar4[uVar8].first_endpoint,(uint)local_5d0.m_second_endpoint);
        lVar10 = 0;
        do {
          uVar3 = local_508[(byte)(&g_dxt5_from_linear)[lVar10]];
          *(uint *)((long)paVar4->alpha_values + lVar10 * 4 + local_5d8 + 0x48 + -0x48) = uVar3;
          auStack_4d8[lVar10] = uVar3;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 8);
        iVar9 = paVar4[uVar8].first_endpoint - paVar4[uVar8].second_endpoint;
        uVar14 = (uint)(iVar9 * iVar9) >> 3;
        if (0x7ff < uVar14) {
          uVar14 = 0x800;
        }
        if ((uint)(iVar9 * iVar9) < 8) {
          uVar14 = 1;
        }
        fVar18 = (float)uVar14;
        lVar10 = 0;
        uVar14 = 0;
        uVar19 = 1;
        uVar20 = 2;
        uVar21 = 3;
        do {
          auVar27._0_4_ =
               ((float)(uVar14 >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uVar14 & 0xffff | 0x4b000000);
          auVar27._4_4_ =
               ((float)(uVar19 >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uVar19 & 0xffff | 0x4b000000);
          auVar27._8_4_ =
               ((float)(uVar20 >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uVar20 & 0xffff | 0x4b000000);
          auVar27._12_4_ =
               ((float)(uVar21 >> 0x10 | 0x53000000) - 5.497642e+11) +
               (float)(uVar21 & 0xffff | 0x4b000000);
          auVar27 = divps(auVar27,_DAT_001baa60);
          fVar26 = (auVar27._0_4_ * 0.14999998 + 1.15) * fVar18;
          fVar28 = (auVar27._4_4_ * 0.14999998 + 1.15) * fVar18;
          fVar30 = (auVar27._8_4_ * 0.14999998 + 1.15) * fVar18;
          fVar31 = (auVar27._12_4_ * 0.14999998 + 1.15) * fVar18;
          uVar22 = (uint)fVar26;
          uVar23 = (uint)fVar28;
          uVar24 = (uint)fVar30;
          uVar25 = (uint)fVar31;
          auStack_4b8[lVar10] = (int)(fVar26 - 2.1474836e+09) & (int)uVar22 >> 0x1f | uVar22;
          auStack_4b8[lVar10 + 1] = (int)(fVar28 - 2.1474836e+09) & (int)uVar23 >> 0x1f | uVar23;
          auStack_4b8[lVar10 + 2] = (int)(fVar30 - 2.1474836e+09) & (int)uVar24 >> 0x1f | uVar24;
          auStack_4b8[lVar10 + 3] = (int)(fVar31 - 2.1474836e+09) & (int)uVar25 >> 0x1f | uVar25;
          lVar10 = lVar10 + 4;
          uVar14 = uVar14 + 4;
          uVar19 = uVar19 + 4;
          uVar20 = uVar20 + 4;
          uVar21 = uVar21 + 4;
        } while (lVar10 != 8);
        if (this->m_has_etc_color_blocks == true) {
          uVar14 = 1;
          if ((6 < iVar9) && (uVar14 = (iVar9 + 0xcU) / 0x12, 0xe < uVar14)) {
            uVar14 = 0xf;
          }
          uVar19 = (uint)local_5d0.m_first_endpoint + (uint)local_5d0.m_second_endpoint + 1 >> 1 &
                   0xff;
          lVar10 = 0;
          do {
            auVar27 = *(undefined1 (*) [16])
                       (determine_alpha_endpoint_codebook_task::stripped_modifier_table[iVar9 < 7] +
                       lVar10);
            iVar29 = auVar27._4_4_;
            auVar32._4_4_ = iVar29;
            auVar32._0_4_ = iVar29;
            auVar32._8_4_ = auVar27._12_4_;
            auVar32._12_4_ = auVar27._12_4_;
            uVar20 = auVar27._0_4_ * uVar14 + uVar19;
            uVar21 = iVar29 * uVar14 + uVar19;
            uVar22 = (int)((auVar27._8_8_ & 0xffffffff) * (ulong)uVar14) + uVar19;
            uVar23 = (int)((auVar32._8_8_ & 0xffffffff) * (ulong)uVar14) + uVar19;
            uVar24 = -(uint)((int)uVar20 < 0xff);
            uVar25 = -(uint)((int)uVar21 < 0xff);
            uVar33 = -(uint)((int)uVar22 < 0xff);
            uVar34 = -(uint)((int)uVar23 < 0xff);
            uVar20 = ~uVar24 & 0xff | uVar20 & uVar24;
            uVar21 = ~uVar25 & 0xff | uVar21 & uVar25;
            uVar22 = ~uVar33 & 0xff | uVar22 & uVar33;
            uVar23 = ~uVar34 & 0xff | uVar23 & uVar34;
            uVar20 = -(uint)(0 < (int)uVar20) & uVar20;
            uVar21 = -(uint)(0 < (int)uVar21) & uVar21;
            uVar22 = -(uint)(0 < (int)uVar22) & uVar22;
            uVar23 = -(uint)(0 < (int)uVar23) & uVar23;
            puVar1 = (uint *)((long)paVar4->alpha_values + lVar10 * 4 + local_5d8 + 0x48 + -0x48);
            *puVar1 = uVar20;
            puVar1[1] = uVar21;
            puVar1[2] = uVar22;
            puVar1[3] = uVar23;
            auStack_4d8[lVar10] = uVar20;
            auStack_4d8[lVar10 + 1] = uVar21;
            auStack_4d8[lVar10 + 2] = uVar22;
            auStack_4d8[lVar10 + 3] = uVar23;
            lVar10 = lVar10 + 4;
          } while (lVar10 != 8);
          paVar4[uVar8].first_endpoint = uVar19;
          paVar4[uVar8].second_endpoint = uVar14 << 4 | (uint)(iVar9 < 7) * 2 + 0xb;
        }
        if (this->m_num_alpha_blocks != 0) {
          uVar15 = 0;
          do {
            local_550 = uVar15 + 1;
            if (paVar4[uVar8].blocks[uVar15 + 1].m_size != 0) {
              local_538 = paVar4[uVar8].blocks + uVar15 + 1;
              local_540 = (ulong)(this->m_params).m_alpha_component_indices[uVar15];
              local_530 = local_558 + local_550;
              uVar15 = 0;
              do {
                local_520 = (ulong)local_538->m_p[uVar15];
                local_528 = (ulong)auStack_4b8[(this->m_block_encodings).m_p[local_520]];
                lVar10 = 0;
                uVar13 = 0;
                do {
                  uVar19 = 0xffffffff;
                  lVar16 = 0;
                  uVar14 = 0;
                  do {
                    if (this->m_has_etc_color_blocks == false) {
                      bVar11 = 7 - *(byte *)((long)&g_dxt5_to_linear + lVar16);
                      if ((local_5d0.m_reordered & 1U) == 0) {
                        bVar11 = *(byte *)((long)&g_dxt5_to_linear + lVar16);
                      }
                    }
                    else {
                      bVar11 = (byte)lVar16;
                    }
                    uVar21 = (uint)this->m_blocks
                                   [local_538->m_p[uVar15] >> (this->m_has_subblocks & 0x1fU)]
                                   [lVar10].field_0.c[local_540] - auStack_4d8[bVar11];
                    uVar20 = -uVar21;
                    if (0 < (int)uVar21) {
                      uVar20 = uVar21;
                    }
                    bVar17 = uVar20 < uVar19;
                    if (bVar17) {
                      uVar19 = uVar20;
                    }
                    if (bVar17) {
                      uVar14 = (uint)bVar11;
                    }
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 8);
                  uVar13 = (ulong)uVar14 | uVar13 << 3;
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 0x10);
                local_530->m_p[local_520] = uVar13 << 0x10 | local_528;
                uVar15 = uVar15 + 1;
                this = local_548;
              } while (uVar15 < local_538->m_size);
            }
            uVar15 = local_550;
          } while (local_550 < this->m_num_alpha_blocks);
        }
        local_598.m_alpha_comp_index = 0;
        local_598.m_highest_quality = true;
        local_598.m_pSelectors = (uint8 *)local_5e8.m_p;
        local_598.m_pPixels = paVar4[uVar8].pixels.m_p;
        local_598.m_num_pixels = paVar4[uVar8].pixels.m_size;
        local_598._48_2_ = (ushort)(this->m_params).m_perceptual << 8;
        local_598.m_error_to_beat = local_5d0.m_error;
        local_598.m_block_index = uVar12;
        local_560 = data;
        if (this->m_has_etc_color_blocks == false) {
          bVar17 = dxt_endpoint_refiner::refine(&local_4e8,&local_598,&local_518);
          lVar10 = local_5d8;
          paVar4[uVar8].refined_alpha = bVar17;
          if (bVar17) {
            paVar4[uVar8].first_endpoint = (uint)local_518.m_low_color;
            paVar4[uVar8].second_endpoint = (uint)local_518.m_high_color;
            dxt5_block::get_block_values
                      (local_508,(uint)local_518.m_low_color,(uint)local_518.m_high_color);
            lVar16 = 0;
            do {
              *(uint *)((long)paVar4->refined_alpha_values + lVar16 * 4 + lVar10) =
                   local_508[(byte)(&g_dxt5_from_linear)[lVar16]];
              lVar16 = lVar16 + 1;
            } while (lVar16 != 8);
            goto LAB_00187bef;
          }
        }
        else {
          paVar4[uVar8].refined_alpha = false;
        }
        uVar5 = *(undefined8 *)paVar4[uVar8].alpha_values;
        uVar6 = *(undefined8 *)(paVar4[uVar8].alpha_values + 2);
        uVar7 = *(undefined8 *)(paVar4[uVar8].alpha_values + 6);
        *(undefined8 *)(paVar4[uVar8].refined_alpha_values + 4) =
             *(undefined8 *)(paVar4[uVar8].alpha_values + 4);
        *(undefined8 *)(paVar4[uVar8].refined_alpha_values + 6) = uVar7;
        *(undefined8 *)paVar4[uVar8].refined_alpha_values = uVar5;
        *(undefined8 *)(paVar4[uVar8].refined_alpha_values + 2) = uVar6;
      }
LAB_00187bef:
      uVar14 = uVar12 + uVar2 + 1;
      data = (uint64)uVar14;
    } while (uVar14 < (this->m_alpha_clusters).m_size);
  }
  if ((uint8 *)local_5e8.m_p != (uint8 *)0x0) {
    crnlib_free(local_5e8.m_p);
  }
  dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer(&local_490);
  return;
}

Assistant:

void dxt_hc::determine_alpha_endpoint_codebook_task(uint64 data, void*) {
  const uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  dxt5_endpoint_optimizer optimizer;
  dxt_endpoint_refiner refiner;
  crnlib::vector<uint8> selectors;

  for (uint cluster_index = (uint)data; cluster_index < m_alpha_clusters.size(); cluster_index += num_tasks) {
    alpha_cluster& cluster = m_alpha_clusters[cluster_index];
    if (cluster.pixels.empty())
      continue;

    dxt5_endpoint_optimizer::params params;
    params.m_pPixels = cluster.pixels.get_ptr();
    params.m_num_pixels = cluster.pixels.size();
    params.m_comp_index = 0;
    params.m_quality = cCRNDXTQualityUber;
    params.m_use_both_block_types = false;

    dxt5_endpoint_optimizer::results results;
    selectors.resize(params.m_num_pixels);
    results.m_pSelectors = selectors.get_ptr();

    optimizer.compute(params, results);
    cluster.first_endpoint = results.m_first_endpoint;
    cluster.second_endpoint = results.m_second_endpoint;
    uint block_values[8], alpha_values[8];
    dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
    for (uint i = 0; i < 8; i++)
      alpha_values[i] = cluster.alpha_values[i] = block_values[g_dxt5_from_linear[i]];
    int delta = cluster.first_endpoint - cluster.second_endpoint;
    uint encoding_weight[8];
    for (uint endpoint_weight = math::clamp<uint>(delta * delta >> 3, 1, 2048), i = 0; i < 8; i++)
      encoding_weight[i] = (uint)(endpoint_weight * math::lerp(1.15f, 1.0f, i / 7.0f));

    if (m_has_etc_color_blocks) {
      static const int stripped_modifier_table[2][8] = {
        {-10, -7, -5, -2, 1, 4, 6, 9},
        {-10, -3, -2, -1, 0, 1, 2, 9}
      };
      int base_codeword = (results.m_first_endpoint + results.m_second_endpoint + 1) >> 1;
      int modifier_index = delta <= 6 ? 13 : 11;
      int multiplier = delta <= 6 ? 1 : math::clamp<int>((delta + 12) / 18, 1, 15);
      const int* modifier = stripped_modifier_table[modifier_index == 11 ? 0 : 1];
      for (int i = 0; i < 8; i++)
        alpha_values[i] = cluster.alpha_values[i] = math::clamp<int>(base_codeword + modifier[i] * multiplier, 0, 255);
      cluster.first_endpoint = base_codeword;
      cluster.second_endpoint = multiplier << 4 | modifier_index;
    }

    for (uint a = 0; a < m_num_alpha_blocks; a++) {
      uint component_index = m_params.m_alpha_component_indices[a];
      crnlib::vector<uint>& blocks = cluster.blocks[cAlpha0 + a];
      for (uint i = 0; i < blocks.size(); i++) {
        uint b = blocks[i];
        uint weight = encoding_weight[m_block_encodings[b]];
        uint64 selector = 0;
        for (uint p = 0; p < 16; p++) {
          uint error_best = cUINT32_MAX;
          uint8 s_best = 0;
          for (uint8 t = 0; t < 8; t++) {
            uint8 s = m_has_etc_color_blocks ? t : results.m_reordered ? 7 - g_dxt5_to_linear[t] : g_dxt5_to_linear[t];
            int delta = m_blocks[m_has_subblocks ? b >> 1 : b][p][component_index] - alpha_values[s];
            uint error = delta >= 0 ? delta : -delta;
            if (error < error_best) {
              s_best = s;
              error_best = error;
            }
          }
          selector = selector << 3 | s_best;
        }
        m_block_selectors[cAlpha0 + a][b] = selector << 16 | weight;
      }
    }

    dxt_endpoint_refiner::params refinerParams;
    dxt_endpoint_refiner::results refinerResults;
    refinerParams.m_perceptual = m_params.m_perceptual;
    refinerParams.m_pSelectors = selectors.get_ptr();
    refinerParams.m_pPixels = cluster.pixels.get_ptr();
    refinerParams.m_num_pixels = cluster.pixels.size();
    refinerParams.m_dxt1_selectors = false;
    refinerParams.m_error_to_beat = results.m_error;
    refinerParams.m_block_index = cluster_index;
    cluster.refined_alpha = !m_has_etc_color_blocks && refiner.refine(refinerParams, refinerResults);
    if (cluster.refined_alpha) {
      cluster.first_endpoint = refinerResults.m_low_color;
      cluster.second_endpoint = refinerResults.m_high_color;
      dxt5_block::get_block_values(block_values, cluster.first_endpoint, cluster.second_endpoint);
      for (uint i = 0; i < 8; i++)
        cluster.refined_alpha_values[i] = block_values[g_dxt5_from_linear[i]];
    } else {
      memcpy(cluster.refined_alpha_values, cluster.alpha_values, sizeof(cluster.refined_alpha_values));
    }
  }
}